

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ImageFeatureType::ByteSizeLong(ImageFeatureType *this)

{
  ImageFeatureType_ColorSpace IVar1;
  SizeFlexibilityCase SVar2;
  int iVar3;
  int64 iVar4;
  size_t sVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ImageFeatureType *this_local;
  
  sStack_18 = 0;
  iVar4 = width(this);
  if (iVar4 != 0) {
    iVar4 = width(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar4);
    sStack_18 = sStack_18 + 1;
  }
  iVar4 = height(this);
  if (iVar4 != 0) {
    iVar4 = height(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int64Size(iVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  IVar1 = colorspace(this);
  if (IVar1 != ImageFeatureType_ColorSpace_INVALID_COLOR_SPACE) {
    IVar1 = colorspace(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(IVar1);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  SVar2 = SizeFlexibility_case(this);
  if (SVar2 != SIZEFLEXIBILITY_NOT_SET) {
    if (SVar2 == kEnumeratedSizes) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes>
                        ((this->SizeFlexibility_).enumeratedsizes_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (SVar2 == kImageSizeRange) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ImageFeatureType_ImageSizeRange>
                        ((this->SizeFlexibility_).imagesizerange_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t ImageFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType)
  size_t total_size = 0;

  // int64 width = 1;
  if (this->width() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->width());
  }

  // int64 height = 2;
  if (this->height() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->height());
  }

  // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
  if (this->colorspace() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->colorspace());
  }

  switch (SizeFlexibility_case()) {
    // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
    case kEnumeratedSizes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SizeFlexibility_.enumeratedsizes_);
      break;
    }
    // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
    case kImageSizeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SizeFlexibility_.imagesizerange_);
      break;
    }
    case SIZEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}